

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O1

unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
 __thiscall
duckdb::FunctionBinder::BindAggregateFunction
          (FunctionBinder *this,AggregateFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *filter,
          AggregateType aggr_type)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  ulong uVar4;
  ulong __new_size;
  undefined7 in_register_00000081;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_info;
  AggregateType local_39;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_38;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_30;
  
  local_38._M_head_impl = (FunctionData *)0x0;
  puVar1 = children[10].
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    (*(code *)puVar1)(&local_30,
                      (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function
                      .name._M_dataplus._M_p,children,filter);
    _Var3._M_head_impl = local_30._M_head_impl;
    _Var2._M_head_impl = local_38._M_head_impl;
    local_30._M_head_impl = (FunctionData *)0x0;
    local_38._M_head_impl = _Var3._M_head_impl;
    if (_Var2._M_head_impl != (FunctionData *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_FunctionData[1])();
    }
    if (local_30._M_head_impl != (FunctionData *)0x0) {
      (*(local_30._M_head_impl)->_vptr_FunctionData[1])();
    }
    uVar4 = ((long)children[3].
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)children[3].
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    __new_size = (long)filter[1].
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
                 (long)(filter->
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3;
    if (uVar4 < __new_size) {
      __new_size = uVar4;
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::resize((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              *)filter,__new_size);
  }
  CastToFunctionArguments
            ((FunctionBinder *)bound_function,(SimpleFunction *)children,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)filter);
  make_uniq<duckdb::BoundAggregateExpression,duckdb::AggregateFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::AggregateType&>
            ((duckdb *)this,(AggregateFunction *)children,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)filter,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             CONCAT71(in_register_00000081,aggr_type),
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_38,&local_39);
  if (local_38._M_head_impl != (FunctionData *)0x0) {
    (*(local_38._M_head_impl)->_vptr_FunctionData[1])();
  }
  return (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
          )(unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
            )this;
}

Assistant:

unique_ptr<BoundAggregateExpression> FunctionBinder::BindAggregateFunction(AggregateFunction bound_function,
                                                                           vector<unique_ptr<Expression>> children,
                                                                           unique_ptr<Expression> filter,
                                                                           AggregateType aggr_type) {
	unique_ptr<FunctionData> bind_info;
	if (bound_function.bind) {
		bind_info = bound_function.bind(context, bound_function, children);
		// we may have lost some arguments in the bind
		children.resize(MinValue(bound_function.arguments.size(), children.size()));
	}

	// check if we need to add casts to the children
	CastToFunctionArguments(bound_function, children);

	return make_uniq<BoundAggregateExpression>(std::move(bound_function), std::move(children), std::move(filter),
	                                           std::move(bind_info), aggr_type);
}